

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http2.c
# Opt level: O1

void Curl_http2_cleanup_dependencies(Curl_easy *data)

{
  Curl_easy *pCVar1;
  Curl_easy *parent;
  Curl_http2_dep *pCVar2;
  
  pCVar2 = (data->set).stream_dependents;
  while (pCVar2 != (Curl_http2_dep *)0x0) {
    pCVar1 = pCVar2->data;
    Curl_http2_remove_child(data,pCVar1);
    parent = (data->set).stream_depends_on;
    if (parent != (Curl_easy *)0x0) {
      Curl_http2_add_child(parent,pCVar1,false);
    }
    pCVar2 = (data->set).stream_dependents;
  }
  pCVar1 = (data->set).stream_depends_on;
  if (pCVar1 != (Curl_easy *)0x0) {
    Curl_http2_remove_child(pCVar1,data);
    return;
  }
  return;
}

Assistant:

void Curl_http2_cleanup_dependencies(struct Curl_easy *data)
{
  while(data->set.stream_dependents) {
    struct Curl_easy *tmp = data->set.stream_dependents->data;
    Curl_http2_remove_child(data, tmp);
    if(data->set.stream_depends_on)
      Curl_http2_add_child(data->set.stream_depends_on, tmp, FALSE);
  }

  if(data->set.stream_depends_on)
    Curl_http2_remove_child(data->set.stream_depends_on, data);
}